

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> * __thiscall
fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int>
           *__return_storage_ptr__,v10 *this,int *args)

{
  int *args_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_48;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  
  local_48._0_4_ = (__return_storage_ptr__->data_).args_[0].field_0.int_value;
  return local_48;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}